

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O0

Ssw_Cla_t * Ssw_ClassesStart(Aig_Man_t *pAig)

{
  int iVar1;
  Ssw_Cla_t *__s;
  Aig_Obj_t ***pppAVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  Ssw_Cla_t *p;
  Aig_Man_t *pAig_local;
  
  __s = (Ssw_Cla_t *)malloc(0x70);
  memset(__s,0,0x70);
  __s->pAig = pAig;
  iVar1 = Aig_ManObjNumMax(pAig);
  pppAVar2 = (Aig_Obj_t ***)calloc((long)iVar1,8);
  __s->pId2Class = pppAVar2;
  iVar1 = Aig_ManObjNumMax(pAig);
  piVar3 = (int *)calloc((long)iVar1,4);
  __s->pClassSizes = piVar3;
  pVVar4 = Vec_PtrAlloc(100);
  __s->vClassOld = pVVar4;
  pVVar4 = Vec_PtrAlloc(100);
  __s->vClassNew = pVVar4;
  pVVar4 = Vec_PtrAlloc(1000);
  __s->vRefined = pVVar4;
  if (pAig->pReprs == (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManObjNumMax(pAig);
    Aig_ManReprStart(pAig,iVar1);
  }
  return __s;
}

Assistant:

Ssw_Cla_t * Ssw_ClassesStart( Aig_Man_t * pAig )
{
    Ssw_Cla_t * p;
    p = ABC_ALLOC( Ssw_Cla_t, 1 );
    memset( p, 0, sizeof(Ssw_Cla_t) );
    p->pAig         = pAig;
    p->pId2Class    = ABC_CALLOC( Aig_Obj_t **, Aig_ManObjNumMax(pAig) );
    p->pClassSizes  = ABC_CALLOC( int, Aig_ManObjNumMax(pAig) );
    p->vClassOld    = Vec_PtrAlloc( 100 );
    p->vClassNew    = Vec_PtrAlloc( 100 );
    p->vRefined     = Vec_PtrAlloc( 1000 );
    if ( pAig->pReprs == NULL )
        Aig_ManReprStart( pAig, Aig_ManObjNumMax(pAig) );
    return p;
}